

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::getDerivatives
          (BeagleCPUImpl<double,_2,_0> *this,double *outSumFirstDerivative,
          double *outSumSecondDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  *outSumFirstDerivative = 0.0;
  auVar7 = ZEXT816(0) << 0x40;
  pdVar3 = this->outFirstDerivativesTmp;
  pdVar4 = this->gPatternWeights;
  uVar5 = (ulong)(uint)(~(this->kPatternCount >> 0x1f) & this->kPatternCount);
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = pdVar3[uVar6];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pdVar4[uVar6];
    auVar7 = vfmadd231sd_fma(auVar7,auVar8,auVar1);
    *outSumFirstDerivative = auVar7._0_8_;
  }
  if (outSumSecondDerivative != (double *)0x0) {
    *outSumSecondDerivative = 0.0;
    auVar7 = ZEXT816(0);
    pdVar3 = this->gPatternWeights;
    pdVar4 = this->outSecondDerivativesTmp;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = pdVar4[uVar6];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pdVar3[uVar6];
      auVar7 = vfmadd231sd_fma(auVar7,auVar9,auVar2);
      *outSumSecondDerivative = auVar7._0_8_;
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getDerivatives(double* outSumFirstDerivative,
                                                      double* outSumSecondDerivative) {

    *outSumFirstDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];
    }

    if (outSumSecondDerivative != NULL) {
        *outSumSecondDerivative = 0.0;
        for (int i = 0; i < kPatternCount; i++) {
            *outSumSecondDerivative += outSecondDerivativesTmp[i] * gPatternWeights[i];
        }
    }

    return BEAGLE_SUCCESS;
}